

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O2

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>::
_solve_impl<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>> *this,
          Matrix<double,_3,_1,_0,_3,_1> *rhs,Matrix<double,__1,_1,_0,__1,_1> *dst)

{
  XprTypeNested cRows;
  XprTypeNested i_00;
  XprTypeNested pMVar1;
  Index i;
  PlainObject c;
  undefined1 local_108 [16];
  XprTypeNested local_f8;
  variable_if_dynamic<long,__1> vStack_f0;
  Index local_e8;
  Index IStack_e0;
  Index local_d8;
  undefined1 local_c8 [24];
  variable_if_dynamic<long,__1> vStack_b0;
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> vStack_a0;
  Index local_98;
  double local_88;
  double dStack_80;
  double local_78;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_> local_68 [56];
  
  cRows = (XprTypeNested)
          ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::nonzeroPivots
                    ((ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  if (cRows == (XprTypeNested)0x0) {
    DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dst);
    return;
  }
  local_78 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  local_88 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0];
  dStack_80 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::householderQ
            ((HouseholderSequenceType *)local_c8,
             (ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this);
  local_108._0_8_ = local_c8._0_8_;
  local_108._8_8_ = local_c8._8_8_;
  local_f8 = (XprTypeNested)(CONCAT71(local_f8._1_7_,local_c8[0x10]) ^ 1);
  local_e8 = local_a8.m_value;
  vStack_f0.m_value = (long)cRows;
  vStack_b0.m_value = (long)cRows;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
  applyOnTheLeft<Eigen::HouseholderSequence<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,1>>
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_88,
             (EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>_>
              *)local_108);
  DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::topLeftCorner<long,long>
            ((Type *)local_c8,this,(long)cRows,(long)cRows);
  local_d8 = local_98;
  local_e8 = local_a8.m_value;
  IStack_e0 = vStack_a0.m_value;
  vStack_f0.m_value = vStack_b0.m_value;
  local_108._0_8_ = local_c8._0_8_;
  local_108._8_8_ = local_c8._8_8_;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<long>
            ((Type *)local_68,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_88,
             (long)cRows);
  TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,-1,-1,false>const,2u,Eigen::Dense>
  ::solveInPlace<1,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>>
            ((TriangularViewImpl<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,_1,_1,false>const,2u,Eigen::Dense>
              *)local_108,local_68);
  i_00 = (XprTypeNested)0x0;
  pMVar1 = cRows;
  if ((long)cRows < 1) {
    pMVar1 = i_00;
  }
  for (; pMVar1 != i_00;
      i_00 = (XprTypeNested)
             ((long)(i_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + 1)) {
    Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1,_1,_false> *)local_108,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_88,(Index)i_00);
    Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *)local_c8,dst,
               (long)*(int *)(this + (long)i_00 * 4 + 0x60));
    (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_c8._0_8_)->m_storage).m_data.
    array[0] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_108._0_8_)->
               m_storage).m_data.array[0];
  }
  for (; (long)cRows < 3;
      cRows = (XprTypeNested)
              ((long)(cRows->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                     .m_data.array + 1)) {
    Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false> *)local_108,dst,
               (long)*(int *)(this + (long)cRows * 4 + 0x60));
    DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1,_1,_false>_>::setZero
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1,_1,_false>_> *)
               local_108);
  }
  return;
}

Assistant:

void ColPivHouseholderQR<_MatrixType>::_solve_impl(const RhsType &rhs, DstType &dst) const
{
  const Index nonzero_pivots = nonzeroPivots();

  if(nonzero_pivots == 0)
  {
    dst.setZero();
    return;
  }

  typename RhsType::PlainObject c(rhs);

  c.applyOnTheLeft(householderQ().setLength(nonzero_pivots).adjoint() );

  m_qr.topLeftCorner(nonzero_pivots, nonzero_pivots)
      .template triangularView<Upper>()
      .solveInPlace(c.topRows(nonzero_pivots));

  for(Index i = 0; i < nonzero_pivots; ++i) dst.row(m_colsPermutation.indices().coeff(i)) = c.row(i);
  for(Index i = nonzero_pivots; i < cols(); ++i) dst.row(m_colsPermutation.indices().coeff(i)).setZero();
}